

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint rotateModulo(uint BitWidth,APInt *rotateAmt)

{
  uint numBits;
  uint64_t uVar1;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  undefined1 local_30 [8];
  APInt rot;
  uint rotBitWidth;
  APInt *rotateAmt_local;
  uint BitWidth_local;
  
  rot._12_4_ = llvm::APInt::getBitWidth(rotateAmt);
  llvm::APInt::APInt((APInt *)local_30,rotateAmt);
  if ((uint)rot._12_4_ < BitWidth) {
    llvm::APInt::zext(&local_40,(uint)rotateAmt);
    llvm::APInt::operator=((APInt *)local_30,&local_40);
    llvm::APInt::~APInt(&local_40);
  }
  numBits = llvm::APInt::getBitWidth((APInt *)local_30);
  llvm::APInt::APInt(&local_60,numBits,(ulong)BitWidth,false);
  llvm::APInt::urem(&local_50,(APInt *)local_30);
  llvm::APInt::operator=((APInt *)local_30,&local_50);
  llvm::APInt::~APInt(&local_50);
  llvm::APInt::~APInt(&local_60);
  uVar1 = llvm::APInt::getLimitedValue((APInt *)local_30,(ulong)BitWidth);
  llvm::APInt::~APInt((APInt *)local_30);
  return (uint)uVar1;
}

Assistant:

static unsigned rotateModulo(unsigned BitWidth, const APInt &rotateAmt) {
  unsigned rotBitWidth = rotateAmt.getBitWidth();
  APInt rot = rotateAmt;
  if (rotBitWidth < BitWidth) {
    // Extend the rotate APInt, so that the urem doesn't divide by 0.
    // e.g. APInt(1, 32) would give APInt(1, 0).
    rot = rotateAmt.zext(BitWidth);
  }
  rot = rot.urem(APInt(rot.getBitWidth(), BitWidth));
  return rot.getLimitedValue(BitWidth);
}